

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O3

Layer * ncnn::Yolov1Detection_layer_creator(void)

{
  Yolov1Detection *this;
  
  this = (Yolov1Detection *)operator_new(0xe0);
  Yolov1Detection::Yolov1Detection(this);
  return &this->super_Layer;
}

Assistant:

Yolov1Detection::Yolov1Detection()
{
    one_blob_only = true;
    support_inplace = true;

    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
    ncnn::ParamDict pd;
    pd.set(0, 1);
    pd.set(1, 1);
    softmax->load_param(pd);
}